

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32
drmp3_init_internal(drmp3 *pMP3,drmp3_read_proc onRead,drmp3_seek_proc onSeek,void *pUserData,
                   drmp3_config *pConfig)

{
  drmp3_bool32 dVar1;
  drmp3_uint32 dVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  drmp3dec *in_RDI;
  undefined8 *in_R8;
  drmp3_src_config srcConfig;
  drmp3_config config;
  void *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  drmp3dec *local_10;
  drmp3_bool32 local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  drmp3dec_init(in_RDI);
  if (local_30 == (undefined8 *)0x0) {
    memset(&local_38,0,8);
  }
  else {
    local_38 = *local_30;
  }
  local_10[1].mdct_overlap[0][5] = (float)local_38;
  if (local_10[1].mdct_overlap[0][5] == 0.0) {
    local_10[1].mdct_overlap[0][5] = 2.8026e-45;
  }
  if (2 < (uint)local_10[1].mdct_overlap[0][5]) {
    local_10[1].mdct_overlap[0][5] = 2.8026e-45;
  }
  local_10[1].mdct_overlap[0][6] = local_38._4_4_;
  if (local_10[1].mdct_overlap[0][6] == 0.0) {
    local_10[1].mdct_overlap[0][6] = 6.17973e-41;
  }
  *(undefined8 *)(local_10[1].mdct_overlap[0] + 7) = local_18;
  *(undefined8 *)(local_10[1].mdct_overlap[0] + 9) = local_20;
  *(undefined8 *)(local_10[1].mdct_overlap[0] + 0xb) = local_28;
  memset(&stack0xffffffffffffffb4,0,0x14);
  dVar1 = drmp3_src_init((drmp3_src_config *)
                         CONCAT44(local_10[1].mdct_overlap[0][5],local_10[1].mdct_overlap[0][6]),
                         (drmp3_src_read_proc)CONCAT44(0xac44,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8,(drmp3_src *)0x106f18);
  if (dVar1 == 0) {
    drmp3_uninit((drmp3 *)0x106f27);
    local_4 = 0;
  }
  else {
    dVar2 = drmp3_decode_next_frame((drmp3 *)0x106f3b);
    if (dVar2 == 0) {
      drmp3_uninit((drmp3 *)0x106f4a);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

drmp3_bool32 drmp3_init_internal(drmp3* pMP3, drmp3_read_proc onRead, drmp3_seek_proc onSeek, void* pUserData, const drmp3_config* pConfig)
{
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(onRead != NULL);

    // This function assumes the output object has already been reset to 0. Do not do that here, otherwise things will break.
    drmp3dec_init(&pMP3->decoder);

    // The config can be null in which case we use defaults.
    drmp3_config config;
    if (pConfig != NULL) {
        config = *pConfig;
    } else {
        drmp3_zero_object(&config);
    }

    pMP3->channels = config.outputChannels;
    if (pMP3->channels == 0) {
        pMP3->channels = DR_MP3_DEFAULT_CHANNELS;
    }

    // Cannot have more than 2 channels.
    if (pMP3->channels > 2) {
        pMP3->channels = 2;
    }

    pMP3->sampleRate = config.outputSampleRate;
    if (pMP3->sampleRate == 0) {
        pMP3->sampleRate = DR_MP3_DEFAULT_SAMPLE_RATE;
    }

    pMP3->onRead = onRead;
    pMP3->onSeek = onSeek;
    pMP3->pUserData = pUserData;

    // We need a sample rate converter for converting the sample rate from the MP3 frames to the requested output sample rate.
    drmp3_src_config srcConfig;
    drmp3_zero_object(&srcConfig);
    srcConfig.sampleRateIn = DR_MP3_DEFAULT_SAMPLE_RATE;
    srcConfig.sampleRateOut = pMP3->sampleRate;
    srcConfig.channels = pMP3->channels;
    srcConfig.algorithm = drmp3_src_algorithm_linear;
    if (!drmp3_src_init(&srcConfig, drmp3_read_src, pMP3, &pMP3->src)) {
        drmp3_uninit(pMP3);
        return DRMP3_FALSE;
    }

    // Decode the first frame to confirm that it is indeed a valid MP3 stream.
    if (!drmp3_decode_next_frame(pMP3)) {
        drmp3_uninit(pMP3);
        return DRMP3_FALSE; // Not a valid MP3 stream.
    }

    return DRMP3_TRUE;
}